

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O0

void __thiscall icu_63::BMPSet::overrideIllegal(BMPSet *this)

{
  int local_1c;
  int32_t i;
  uint32_t mask;
  uint32_t bits;
  BMPSet *this_local;
  
  if (this->containsFFFD == '\0') {
    for (local_1c = 0x20; local_1c < 0x40; local_1c = local_1c + 1) {
      this->bmpBlockBits[local_1c] = this->bmpBlockBits[local_1c] & 0xdfffdfff;
    }
  }
  else {
    for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
      this->table7FF[local_1c] = this->table7FF[local_1c] | 3;
    }
    for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 1) {
      this->bmpBlockBits[local_1c] = this->bmpBlockBits[local_1c] | 1;
    }
    for (local_1c = 0x20; local_1c < 0x40; local_1c = local_1c + 1) {
      this->bmpBlockBits[local_1c] = this->bmpBlockBits[local_1c] & 0xdfffdfff | 0x2000;
    }
  }
  return;
}

Assistant:

void BMPSet::overrideIllegal() {
    uint32_t bits, mask;
    int32_t i;

    if(containsFFFD) {
        bits=3;                 // Lead bytes 0xC0 and 0xC1.
        for(i=0; i<64; ++i) {
            table7FF[i]|=bits;
        }

        bits=1;                 // Lead byte 0xE0.
        for(i=0; i<32; ++i) {   // First half of 4k block.
            bmpBlockBits[i]|=bits;
        }

        mask= static_cast<uint32_t>(~(0x10001<<0xd));   // Lead byte 0xED.
        bits=1<<0xd;
        for(i=32; i<64; ++i) {  // Second half of 4k block.
            bmpBlockBits[i]=(bmpBlockBits[i]&mask)|bits;
        }
    } else {
        mask= static_cast<uint32_t>(~(0x10001<<0xd));   // Lead byte 0xED.
        for(i=32; i<64; ++i) {  // Second half of 4k block.
            bmpBlockBits[i]&=mask;
        }
    }
}